

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::fixBlockUniformLayoutPacking
          (TParseContext *this,TQualifier *qualifier,TTypeList *originTypeList,
          TTypeList *tmpTypeList)

{
  _Vector_impl_data *p_Var1;
  _Vector_impl_data *p_Var2;
  pointer pTVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *this_00;
  TTypeList *originTypeList_00;
  TTypeList *tmpTypeList_00;
  TQualifier *s;
  byte bVar6;
  int __flags;
  long lVar7;
  ulong uVar8;
  void *__child_stack;
  TParseContext *this_01;
  void *in_R8;
  _Vector_impl_data *p_Var10;
  uint uVar11;
  ulong uVar12;
  undefined4 extraout_var_02;
  TQualifier *pTVar9;
  
  if ((tmpTypeList != (TTypeList *)0x0) &&
     ((long)(originTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(originTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start !=
      (long)(tmpTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(tmpTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    __assert_fail("tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x26b9,
                  "void glslang::TParseContext::fixBlockUniformLayoutPacking(TQualifier &, TTypeList *, TTypeList *)"
                 );
  }
  p_Var1 = &(originTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data;
  p_Var2 = &(tmpTypeList->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data;
  uVar11 = 0;
  s = qualifier;
  do {
    uVar12 = (ulong)uVar11;
    pTVar3 = (originTypeList->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(originTypeList->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 5) <= uVar12) {
      return;
    }
    pTVar9 = qualifier;
    if ((qualifier->field_0x10 & 0xf) != 0) {
      if (tmpTypeList == (TTypeList *)0x0) {
        iVar5 = (*(pTVar3[uVar12].type)->_vptr_TType[10])();
        if ((*(byte *)(CONCAT44(extraout_var_00,iVar5) + 0x10) & 0xf) == 0) {
          iVar5 = (*(p_Var1->_M_start[uVar12].type)->_vptr_TType[0x1a])();
          cVar4 = (char)iVar5;
          pTVar9 = (TQualifier *)p_Var1;
          goto LAB_0042754a;
        }
      }
      else {
        iVar5 = (*(p_Var2->_M_start[uVar12].type)->_vptr_TType[10])();
        if ((*(byte *)(CONCAT44(extraout_var,iVar5) + 0x10) & 0xf) == 0) {
          iVar5 = (*(p_Var2->_M_start[uVar12].type)->_vptr_TType[0x1a])();
          cVar4 = (char)iVar5;
          pTVar9 = (TQualifier *)p_Var2;
LAB_0042754a:
          if (cVar4 == '\0') {
            bVar6 = qualifier->field_0x10;
            lVar7 = uVar12 * 0x20;
            iVar5 = (*(((pointer)pTVar9->semanticName)[uVar12].type)->_vptr_TType[10])();
            uVar8 = CONCAT71((int7)((ulong)lVar7 >> 8),
                             *(undefined1 *)(CONCAT44(extraout_var_01,iVar5) + 0x10)) &
                    0xfffffffffffffff0;
            bVar6 = (byte)uVar8 | bVar6 & 0xf;
            pTVar9 = (TQualifier *)CONCAT71((int7)(uVar8 >> 8),bVar6);
            *(byte *)(CONCAT44(extraout_var_01,iVar5) + 0x10) = bVar6;
          }
        }
      }
    }
    __flags = (int)pTVar9;
    iVar5 = (*(p_Var1->_M_start[uVar12].type)->_vptr_TType[7])();
    if (iVar5 == 0xf) {
      if (tmpTypeList == (TTypeList *)0x0) {
        iVar5 = TType::clone(p_Var1->_M_start[uVar12].type,(__fn *)s,__child_stack,__flags,in_R8);
        this_00 = (TType *)CONCAT44(extraout_var_02,iVar5);
        p_Var10 = p_Var1;
      }
      else {
        this_00 = p_Var2->_M_start[uVar12].type;
        p_Var10 = p_Var2;
      }
      originTypeList_00 = TType::getWritableStruct(p_Var1->_M_start[uVar12].type);
      tmpTypeList_00 = TType::getWritableStruct(this_00);
      this_01 = this;
      fixBlockUniformLayoutPacking(this,qualifier,originTypeList_00,tmpTypeList_00);
      s = (TQualifier *)
          recordStructCopy(this_01,&this->packingFixRecord,p_Var1->_M_start[uVar12].type,this_00);
      TType::setStruct(p_Var10->_M_start[uVar12].type,(TTypeList *)s);
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void TParseContext::fixBlockUniformLayoutPacking(TQualifier& qualifier, TTypeList* originTypeList,
                                                 TTypeList* tmpTypeList)
{
    assert(tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size());
    for (unsigned int member = 0; member < originTypeList->size(); ++member) {
        if (qualifier.layoutPacking != ElpNone) {
            if (tmpTypeList == nullptr) {
                if ((*originTypeList)[member].type->getQualifier().layoutPacking == ElpNone &&
                    !(*originTypeList)[member].type->isScalarOrVector()) {
                    (*originTypeList)[member].type->getQualifier().layoutPacking = qualifier.layoutPacking;
                }
            } else {
                if ((*tmpTypeList)[member].type->getQualifier().layoutPacking == ElpNone &&
                    !(*tmpTypeList)[member].type->isScalarOrVector()) {
                    (*tmpTypeList)[member].type->getQualifier().layoutPacking = qualifier.layoutPacking;
                }
            }
        }

        if ((*originTypeList)[member].type->getBasicType() == EbtStruct) {
            // Deep copy the type in pool.
            // Because, struct use in different block may have different layout qualifier.
            // We have to new a object to distinguish between them.
            const TType* tmpType = tmpTypeList == nullptr ?
                (*originTypeList)[member].type->clone() : (*tmpTypeList)[member].type;

            fixBlockUniformLayoutPacking(qualifier, (*originTypeList)[member].type->getWritableStruct(),
                                         tmpType->getWritableStruct());

            const TTypeList* structure = recordStructCopy(packingFixRecord, (*originTypeList)[member].type, tmpType);

            if (tmpTypeList == nullptr) {
                (*originTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
            if (tmpTypeList != nullptr) {
                (*tmpTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
        }
    }
}